

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

bool __thiscall
trieste::detail::Inside<7UL>::match(Inside<7UL> *this,NodeIt *it,Node *parent,Match *match)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  element_type *this_00;
  Token *this_01;
  element_type *peVar4;
  value_type *type;
  const_iterator __end0;
  const_iterator __begin0;
  array<trieste::Token,_7UL> *__range3;
  Match *match_local;
  Node *parent_local;
  NodeIt *it_local;
  Inside<7UL> *this_local;
  bool local_9;
  
  __end0 = std::array<trieste::Token,_7UL>::begin(&this->types);
  pvVar3 = std::array<trieste::Token,_7UL>::end(&this->types);
  while( true ) {
    if (__end0 == pvVar3) {
      return false;
    }
    this_00 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)parent);
    this_01 = NodeDef::type(this_00);
    bVar1 = Token::operator==(this_01,__end0);
    if (bVar1) break;
    __end0 = __end0 + 1;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&(this->super_PatternDef).continuation);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_PatternDef).continuation);
    iVar2 = (*peVar4->_vptr_PatternDef[4])(peVar4,it,parent,match);
    local_9 = (bool)((byte)iVar2 & 1);
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        for (const auto& type : types)
        {
          if (parent->type() == type)
            return match_continuation(it, parent, match);
        }

        return false;
      }